

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::anon_unknown_1::
BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>::
init(BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
     *this,EVP_PKEY_CTX *ctx)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  deInt32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  ShaderProgram *this_00;
  ProgramSources *pPVar7;
  TestLog *log;
  TestError *pTVar8;
  allocator<char> local_1e1;
  string local_1e0;
  undefined1 local_1ba;
  allocator<char> local_1b9;
  string local_1b8;
  undefined1 local_192;
  allocator<char> local_191;
  string local_190;
  ShaderSource local_170;
  allocator<char> local_141;
  string local_140;
  ShaderSource local_120;
  ProgramSources local_e8;
  long local_18;
  Functions *gl;
  BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  *this_local;
  
  gl = (Functions *)this;
  pRVar6 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar3);
  if ((this->m_useGL & 1U) != 0) {
    this_00 = (ShaderProgram *)operator_new(0xd0);
    local_192 = 1;
    pRVar6 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
    glu::ProgramSources::ProgramSources(&local_e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,
               "#version 300 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
               ,&local_141);
    glu::VertexSource::VertexSource((VertexSource *)&local_120,&local_140);
    pPVar7 = glu::ProgramSources::operator<<(&local_e8,&local_120);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,
               "#version 300 es\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\nvoid main (void)\n{\n\tdEQP_FragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}\n"
               ,&local_191);
    glu::FragmentSource::FragmentSource((FragmentSource *)&local_170,&local_190);
    pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_170);
    glu::ShaderProgram::ShaderProgram(this_00,pRVar6,pPVar7);
    local_192 = 0;
    this->m_dummyProgram = this_00;
    glu::FragmentSource::~FragmentSource((FragmentSource *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator(&local_191);
    glu::VertexSource::~VertexSource((VertexSource *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    glu::ProgramSources::~ProgramSources(&local_e8);
    bVar2 = glu::ShaderProgram::isOk(this->m_dummyProgram);
    if (!bVar2) {
      log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
      ;
      glu::operator<<(log,this->m_dummyProgram);
      local_1ba = 1;
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b8,"failed to build shader program",&local_1b9);
      tcu::TestError::TestError(pTVar8,&local_1b8);
      local_1ba = 0;
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    pcVar1 = *(code **)(local_18 + 0x780);
    dVar4 = glu::ShaderProgram::getProgram(this->m_dummyProgram);
    dVar5 = (*pcVar1)(dVar4,"a_position");
    this->m_dummyProgramPosLoc = dVar5;
    if (this->m_dummyProgramPosLoc == -1) {
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,"a_position location was -1",&local_1e1);
      tcu::TestError::TestError(pTVar8,&local_1e0);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  return (int)this;
}

Assistant:

void BasicBufferCase<SampleType>::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (!m_useGL)
		return;

	// \note Viewport size is not checked, it won't matter if the render target actually is smaller hhan DUMMY_RENDER_AREA_SIZE

	// dummy shader

	m_dummyProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(s_dummyVertexShader) << glu::FragmentSource(s_dummyFragnentShader));
	if (!m_dummyProgram->isOk())
	{
		m_testCtx.getLog() << *m_dummyProgram;
		throw tcu::TestError("failed to build shader program");
	}

	m_dummyProgramPosLoc = gl.getAttribLocation(m_dummyProgram->getProgram(), "a_position");
	if (m_dummyProgramPosLoc == -1)
		throw tcu::TestError("a_position location was -1");
}